

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

void djgt_release(djg_texture *texture)

{
  djg_texture *pdVar1;
  djg_texture *tmp;
  djg_texture *texture_local;
  
  tmp = texture;
  if (texture == (djg_texture *)0x0) {
    __assert_fail("texture",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x31d,"void djgt_release(djg_texture *)");
  }
  while (tmp != (djg_texture *)0x0) {
    pdVar1 = tmp->next;
    free(tmp->texels);
    free(tmp);
    tmp = pdVar1;
  }
  return;
}

Assistant:

DJGDEF void djgt_release(djg_texture *texture)
{
    djg_texture *tmp;

    DJG_ASSERT(texture);
    while (texture) {
        tmp = texture;
        texture = texture->next;
        DJG_FREE(tmp->texels);
        DJG_FREE(tmp);
    }
}